

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlDocDumpFormatMemoryEnc
               (xmlDocPtr out_doc,xmlChar **doc_txt_ptr,int *doc_txt_len,char *txt_encoding,
               int format)

{
  int code;
  size_t sVar1;
  xmlChar *pxVar2;
  xmlCharEncodingHandlerPtr pxStack_d8;
  int res;
  xmlCharEncodingHandlerPtr conv_hdlr;
  xmlOutputBufferPtr out_buff;
  int dummy;
  int options;
  xmlSaveCtxt ctxt;
  xmlChar *pxStack_28;
  int format_local;
  char *txt_encoding_local;
  int *doc_txt_len_local;
  xmlChar **doc_txt_ptr_local;
  xmlDocPtr out_doc_local;
  
  out_buff._0_4_ = 0;
  conv_hdlr = (xmlCharEncodingHandlerPtr)0x0;
  pxStack_d8 = (xmlCharEncodingHandlerPtr)0x0;
  txt_encoding_local = (char *)doc_txt_len;
  if (doc_txt_len == (int *)0x0) {
    txt_encoding_local = (char *)&out_buff;
  }
  if (doc_txt_ptr == (xmlChar **)0x0) {
    txt_encoding_local[0] = '\0';
    txt_encoding_local[1] = '\0';
    txt_encoding_local[2] = '\0';
    txt_encoding_local[3] = '\0';
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    ctxt.escape._4_4_ = format;
    txt_encoding_local[0] = '\0';
    txt_encoding_local[1] = '\0';
    txt_encoding_local[2] = '\0';
    txt_encoding_local[3] = '\0';
    if (out_doc != (xmlDocPtr)0x0) {
      pxStack_28 = (xmlChar *)txt_encoding;
      if (txt_encoding == (char *)0x0) {
        pxStack_28 = out_doc->encoding;
      }
      if ((pxStack_28 == (xmlChar *)0x0) ||
         (code = xmlOpenCharEncodingHandler((char *)pxStack_28,1,&stack0xffffffffffffff28),
         code == 0)) {
        conv_hdlr = (xmlCharEncodingHandlerPtr)xmlAllocOutputBuffer(pxStack_d8);
        if (conv_hdlr == (xmlCharEncodingHandlerPtr)0x0) {
          xmlSaveErrMemory((xmlOutputBufferPtr)0x0);
        }
        else {
          memset(&dummy,0,0x90);
          ctxt.handler = conv_hdlr;
          ctxt.buf._4_4_ = 0;
          ctxt.filename = pxStack_28;
          out_buff._4_4_ = 0x20;
          if (ctxt.escape._4_4_ != 0) {
            out_buff._4_4_ = 0x21;
          }
          xmlSaveCtxtInit((xmlSaveCtxtPtr)&dummy,out_buff._4_4_);
          xmlDocContentDumpOutput((xmlSaveCtxtPtr)&dummy,out_doc);
          xmlOutputBufferFlush((xmlOutputBufferPtr)conv_hdlr);
          if (*(int *)((long)&conv_hdlr->outputCtxt + 4) == 0) {
            if (conv_hdlr->inputCtxt == (void *)0x0) {
              sVar1 = xmlBufUse((xmlBufPtr)conv_hdlr->iconv_out);
              *(int *)txt_encoding_local = (int)sVar1;
              pxVar2 = xmlBufDetach((xmlBufPtr)conv_hdlr->iconv_out);
              *doc_txt_ptr = pxVar2;
            }
            else {
              sVar1 = xmlBufUse((xmlBufPtr)conv_hdlr->inputCtxt);
              *(int *)txt_encoding_local = (int)sVar1;
              pxVar2 = xmlBufDetach((xmlBufPtr)conv_hdlr->inputCtxt);
              *doc_txt_ptr = pxVar2;
            }
          }
          xmlOutputBufferClose((xmlOutputBufferPtr)conv_hdlr);
        }
      }
      else {
        xmlSaveErr((xmlOutputBufferPtr)0x0,code,(xmlNodePtr)0x0,(char *)pxStack_28);
      }
    }
  }
  return;
}

Assistant:

void
xmlDocDumpFormatMemoryEnc(xmlDocPtr out_doc, xmlChar **doc_txt_ptr,
		int * doc_txt_len, const char * txt_encoding,
		int format) {
    xmlSaveCtxt ctxt;
    int options;
    int                         dummy = 0;
    xmlOutputBufferPtr          out_buff = NULL;
    xmlCharEncodingHandlerPtr   conv_hdlr = NULL;

    if (doc_txt_len == NULL) {
        doc_txt_len = &dummy;   /*  Continue, caller just won't get length */
    }

    if (doc_txt_ptr == NULL) {
        *doc_txt_len = 0;
        return;
    }

    *doc_txt_ptr = NULL;
    *doc_txt_len = 0;

    if (out_doc == NULL) {
        /*  No document, no output  */
        return;
    }

    /*
     *  Validate the encoding value, if provided.
     *  This logic is copied from xmlSaveFileEnc.
     */

    if (txt_encoding == NULL)
	txt_encoding = (const char *) out_doc->encoding;
    if (txt_encoding != NULL) {
        int res;

	res = xmlOpenCharEncodingHandler(txt_encoding, /* output */ 1,
                                         &conv_hdlr);
	if (res != XML_ERR_OK) {
            xmlSaveErr(NULL, res, NULL, txt_encoding);
	    return;
	}
    }

    out_buff = xmlAllocOutputBuffer(conv_hdlr);
    if (out_buff == NULL ) {
        xmlSaveErrMemory(NULL);
        return;
    }

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = out_buff;
    ctxt.level = 0;
    ctxt.encoding = (const xmlChar *) txt_encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlDocContentDumpOutput(&ctxt, out_doc);
    xmlOutputBufferFlush(out_buff);

    if (!out_buff->error) {
        if (out_buff->conv != NULL) {
            *doc_txt_len = xmlBufUse(out_buff->conv);
            *doc_txt_ptr = xmlBufDetach(out_buff->conv);
        } else {
            *doc_txt_len = xmlBufUse(out_buff->buffer);
            *doc_txt_ptr = xmlBufDetach(out_buff->buffer);
        }
    }

    xmlOutputBufferClose(out_buff);
}